

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

ssize_t __thiscall
pstack::OffsetReader::read(OffsetReader *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  Exception *this_00;
  Exception *pEVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  Exception local_1c8;
  size_t local_28;
  char *ptr_local;
  size_t count_local;
  Off off_local;
  OffsetReader *this_local;
  
  count_local = CONCAT44(in_register_00000034,__fd);
  local_28 = __nbytes;
  ptr_local = (char *)__buf;
  off_local = (Off)this;
  if (this->length < count_local) {
    this_00 = (Exception *)__cxa_allocate_exception();
    memset(&local_1c8,0,0x1a0);
    Exception::Exception(&local_1c8);
    pEVar2 = Exception::operator<<(&local_1c8,(char (*) [25])"read past end of object ");
    pEVar2 = Exception::operator<<(pEVar2,this);
    Exception::Exception(this_00,pEVar2);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  if (this->length < count_local + (long)__buf) {
    ptr_local = (char *)(this->length - count_local);
  }
  peVar3 = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->upstream);
  iVar1 = (*peVar3->_vptr_Reader[2])(peVar3,count_local + this->offset,ptr_local,local_28);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t
OffsetReader::read(Off off, size_t count, char *ptr) const {
    if (off > length)
       throw Exception() << "read past end of object " << *this;
    if (off + Off(count) > length)
       count = length - off;
    return upstream->read(off + offset, count, ptr);
}